

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

RpcValue __thiscall
miniros::master::Master::getParam(Master *this,string *caller_id,string *key,Connection *param_3)

{
  size_type *psVar1;
  XmlRpcValue *pXVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  ulong uVar6;
  RpcValue RVar7;
  RpcValue value;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  XmlRpcValue local_68;
  long *local_58 [2];
  long local_48 [2];
  Type local_38;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  ParameterStorage::getParam((ParameterStorage *)&stack0xffffffffffffffc8,caller_id + 0x1d,key);
  if (local_38 == TypeInvalid) {
    local_c8._M_dataplus._M_p._0_4_ = 0xffffffff;
    pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_c8);
    local_58[0] = local_48;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Parameter [","");
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_58,
                                (ulong)(param_3->super_XmlRpcSource)._vptr_XmlRpcSource);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_98 = *puVar5;
      uStack_90 = (undefined4)plVar3[3];
      uStack_8c = *(undefined4 *)((long)plVar3 + 0x1c);
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar5;
      local_a8 = (ulong *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_88 = local_78;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"] is not set","");
    uVar6 = 0xf;
    if (local_a8 != &local_98) {
      uVar6 = local_98;
    }
    if (uVar6 < (ulong)(local_80 + local_a0)) {
      uVar6 = 0xf;
      if (local_88 != local_78) {
        uVar6 = local_78[0];
      }
      if (uVar6 < (ulong)(local_80 + local_a0)) goto LAB_0023054d;
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_0023054d:
      puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar1 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_c8.field_2._M_allocated_capacity = *psVar1;
      local_c8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar1;
      local_c8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_c8._M_string_length = puVar4[1];
    *puVar4 = psVar1;
    puVar4[1] = 0;
    *(undefined1 *)psVar1 = 0;
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_68,&local_c8);
    pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    XmlRpc::XmlRpcValue::operator=(pXVar2,&local_68);
    XmlRpc::XmlRpcValue::invalidate(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
    pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_c8);
    goto LAB_00230660;
  }
  local_c8._M_dataplus._M_p._0_4_ = 1;
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_c8);
  local_58[0] = local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Parameter [","");
  plVar3 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_58,
                              (ulong)(param_3->super_XmlRpcSource)._vptr_XmlRpcSource);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_98 = *puVar5;
    uStack_90 = (undefined4)plVar3[3];
    uStack_8c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar5;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"]","");
  uVar6 = 0xf;
  if (local_a8 != &local_98) {
    uVar6 = local_98;
  }
  if (uVar6 < (ulong)(local_80 + local_a0)) {
    uVar6 = 0xf;
    if (local_88 != local_78) {
      uVar6 = local_78[0];
    }
    if (uVar6 < (ulong)(local_80 + local_a0)) goto LAB_002303b6;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_002303b6:
    puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_c8.field_2._M_allocated_capacity = *psVar1;
    local_c8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar1;
    local_c8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_c8._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_68,&local_c8);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&local_68);
  XmlRpc::XmlRpcValue::invalidate(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&stack0xffffffffffffffc8);
LAB_00230660:
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&stack0xffffffffffffffc8);
  RVar7._value.asDouble = extraout_RDX.asDouble;
  RVar7._0_8_ = this;
  return RVar7;
}

Assistant:

Master::RpcValue Master::getParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  RpcValue value = m_parameterStorage.getParam(caller_id, key);
  if (!value.valid()) {
    res[0] = -1;
    res[1] = std::string("Parameter [") + key + std::string("] is not set");
    res[2] = 0;
  } else {
    res[0] = 1;
    res[1] = std::string("Parameter [") + key + std::string("]");
    res[2] = value;
  }
  return res;
}